

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O0

int __thiscall ON_PolyEdgeCurve::FindCurve(ON_PolyEdgeCurve *this,ON_Curve *curve)

{
  int iVar1;
  ON_PolyEdgeSegment *this_00;
  ON_Curve *pOVar2;
  ON_BrepEdge *pOVar3;
  ON_PolyEdgeSegment *segment;
  int local_20;
  int count;
  int i;
  int rc;
  ON_Curve *curve_local;
  ON_PolyEdgeCurve *this_local;
  
  if (curve != (ON_Curve *)0x0) {
    iVar1 = SegmentCount(this);
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      this_00 = SegmentCurve(this,local_20);
      if ((this_00 != (ON_PolyEdgeSegment *)0x0) &&
         ((((ON_PolyEdgeSegment *)curve == this_00 ||
           (pOVar2 = ON_CurveProxy::ProxyCurve(&this_00->super_ON_CurveProxy), curve == pOVar2)) ||
          (pOVar3 = ON_PolyEdgeSegment::BrepEdge(this_00), (ON_BrepEdge *)curve == pOVar3)))) {
        return local_20;
      }
    }
  }
  return -1;
}

Assistant:

int ON_PolyEdgeCurve::FindCurve( const ON_Curve* curve) const
{
  int rc = -1;
  if ( 0 != curve )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if (    0 != segment 
           && (curve == segment || curve == segment->ProxyCurve() || curve == segment->BrepEdge()) )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}